

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
LineFiller::score_function
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,LineFiller *this,
          sgNodeID_t n1,sgNodeID_t n2,
          vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *paths)

{
  PerfectMatch *pPVar1;
  uint *puVar2;
  int iVar3;
  undefined4 uVar4;
  int32_t iVar5;
  int32_t iVar6;
  undefined6 uVar7;
  iterator iVar8;
  iterator iVar9;
  vector<long,_std::allocator<long>_> *pvVar10;
  uint uVar11;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long *rid;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> *__range2_1;
  vector<long,_std::allocator<long>_> *__range2;
  pointer pSVar16;
  pointer __args;
  PerfectMatch *match;
  PerfectMatch *pPVar17;
  uint uVar18;
  long *node;
  uint *puVar19;
  int iVar20;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> shared_matches;
  vector<long,_std::allocator<long>_> abs_nodes;
  vector<long,_std::allocator<long>_> shared_reads;
  value_type reads_n2;
  value_type reads_n1;
  PerfectMatch *local_e8;
  iterator iStack_e0;
  PerfectMatch *local_d8;
  vector<long,_std::allocator<long>_> local_c8;
  uint *local_a8;
  iterator iStack_a0;
  long *local_98;
  int local_8c;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *local_88;
  undefined8 local_80;
  vector<long,_std::allocator<long>_> local_78;
  vector<long,_std::allocator<long>_> local_60;
  vector<long,_std::allocator<long>_> *local_48;
  pointer local_40;
  ulong local_38;
  
  uVar13 = (ulong)(uint)-(int)n1;
  if (0 < (int)n1) {
    uVar13 = n1 & 0xffffffff;
  }
  local_88 = paths;
  local_48 = __return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_60,
             (vector<long,_std::allocator<long>_> *)
             (uVar13 * 0x18 + *(long *)(*(long *)(this + 8) + 0x48)));
  uVar13 = (ulong)(uint)-(int)n2;
  if (0 < (int)n2) {
    uVar13 = n2 & 0xffffffff;
  }
  std::vector<long,_std::allocator<long>_>::vector
            (&local_78,
             (vector<long,_std::allocator<long>_> *)
             (uVar13 * 0x18 + *(long *)(*(long *)(this + 8) + 0x48)));
  local_a8 = (uint *)0x0;
  iStack_a0._M_current = (long *)0x0;
  local_98 = (long *)0x0;
  if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish ||
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_e8 = (PerfectMatch *)0x0;
    iStack_e0._M_current = (PerfectMatch *)0x0;
    local_d8 = (PerfectMatch *)0x0;
  }
  else {
    __args = local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar19 = (uint *)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      uVar18 = *puVar19;
      uVar11 = (uint)*__args;
      uVar14 = -uVar11;
      if (0 < (int)uVar11) {
        uVar14 = uVar11;
      }
      uVar11 = -uVar18;
      if (0 < (int)uVar18) {
        uVar11 = uVar18;
      }
      if (uVar14 < uVar11) {
        __args = __args + 1;
      }
      else {
        if (uVar14 <= uVar11) {
          if (iStack_a0._M_current == local_98) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_a8,iStack_a0,__args);
          }
          else {
            *iStack_a0._M_current = *__args;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          __args = __args + 1;
        }
        puVar19 = puVar19 + 2;
      }
      iVar9._M_current = iStack_a0._M_current;
    } while ((__args != local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish) &&
            (puVar19 !=
             (uint *)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish));
    local_e8 = (PerfectMatch *)0x0;
    iStack_e0._M_current = (PerfectMatch *)0x0;
    local_d8 = (PerfectMatch *)0x0;
    for (puVar19 = local_a8; puVar19 != (uint *)iVar9._M_current; puVar19 = puVar19 + 2) {
      uVar18 = *puVar19;
      uVar14 = -uVar18;
      if (0 < (int)uVar18) {
        uVar14 = uVar18;
      }
      pPVar1 = *(PerfectMatch **)(*(long *)(*(long *)(this + 8) + 0x18) + 8 + (ulong)uVar14 * 0x18);
      for (pPVar17 = *(PerfectMatch **)
                      (*(long *)(*(long *)(this + 8) + 0x18) + (ulong)uVar14 * 0x18);
          pPVar17 != pPVar1; pPVar17 = pPVar17 + 1) {
        if (iStack_e0._M_current == local_d8) {
          std::vector<PerfectMatch,std::allocator<PerfectMatch>>::
          _M_realloc_insert<PerfectMatch_const&>
                    ((vector<PerfectMatch,std::allocator<PerfectMatch>> *)&local_e8,iStack_e0,
                     pPVar17);
        }
        else {
          uVar7 = *(undefined6 *)&pPVar17->field_0x12;
          (iStack_e0._M_current)->size = pPVar17->size;
          *(undefined6 *)&(iStack_e0._M_current)->field_0x12 = uVar7;
          uVar4 = *(undefined4 *)((long)&pPVar17->node + 4);
          iVar5 = pPVar17->node_position;
          iVar6 = pPVar17->read_position;
          *(int *)&(iStack_e0._M_current)->node = (int)pPVar17->node;
          *(undefined4 *)((long)&(iStack_e0._M_current)->node + 4) = uVar4;
          (iStack_e0._M_current)->node_position = iVar5;
          (iStack_e0._M_current)->read_position = iVar6;
          iStack_e0._M_current = iStack_e0._M_current + 1;
        }
      }
    }
  }
  pSVar16 = (local_88->
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (local_88->
             super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = 0;
  if (pSVar16 != local_40) {
    iVar20 = 0;
    iVar15 = 0;
    do {
      local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (long *)0x0;
      local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      puVar2 = (uint *)(pSVar16->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      local_8c = iVar20;
      for (puVar19 = (uint *)(pSVar16->nodes).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
          iVar8._M_current = iStack_e0._M_current, puVar19 != puVar2; puVar19 = puVar19 + 2) {
        uVar18 = *puVar19;
        uVar14 = -uVar18;
        if (0 < (int)uVar18) {
          uVar14 = uVar18;
        }
        local_80 = (ulong)uVar14;
        if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_80);
        }
        else {
          *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_80;
          local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar18 = 0;
      local_38 = uVar13;
      for (pPVar17 = local_e8; pPVar17 != iVar8._M_current; pPVar17 = pPVar17 + 1) {
        iVar20 = (int)pPVar17->node;
        iVar3 = -iVar20;
        if (0 < iVar20) {
          iVar3 = iVar20;
        }
        uVar13 = local_80 >> 0x20;
        local_80 = CONCAT44((int)uVar13,iVar3);
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_80);
        uVar14 = 0;
        if (_Var12._M_current !=
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          uVar14 = (uint)pPVar17->size;
        }
        uVar18 = uVar18 + uVar14;
      }
      iVar20 = local_8c;
      if ((int)local_38 < (int)uVar18) {
        iVar20 = iVar15;
      }
      uVar13 = local_38 & 0xffffffff;
      if ((int)local_38 < (int)uVar18) {
        uVar13 = (ulong)uVar18;
      }
      if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar15 = iVar15 + 1;
      pSVar16 = pSVar16 + 1;
    } while (pSVar16 != local_40);
    pSVar16 = (local_88->
              super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)iVar20;
  }
  pvVar10 = local_48;
  std::vector<long,_std::allocator<long>_>::vector(local_48,&pSVar16[uVar13].nodes);
  if (local_e8 != (PerfectMatch *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_a8 != (uint *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if ((uint *)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pvVar10;
}

Assistant:

std::vector<sgNodeID_t> LineFiller::score_function(sgNodeID_t n1, sgNodeID_t n2, std::vector<SequenceDistanceGraphPath> paths) {

    // Find all reads spanning both nodes

    auto reads_n1 = lrr.node_reads[abs(n1)];
    auto reads_n2 = lrr.node_reads[abs(n2)];
//    std::cout << "Reads in n1: "<< reads_n1.size()<< " reads in n2: "<< reads_n2.size() << std::endl;

    // Get all matches for both ends of the gap
    std::vector<int64_t> shared_reads;
    std::set_intersection(reads_n1.begin(), reads_n1.end(), reads_n2.begin(), reads_n2.end(),  std::back_inserter(shared_reads), [](int64_t r1, int64_t r2){return abs(r1) < abs(r2);});
//    std::cout << "Shared reads: " << shared_reads.size() << std::endl;

    std::vector<PerfectMatch> shared_matches;
    for (const auto& rid: shared_reads){
        for (const auto& match: lrr.read_perfect_matches[abs(rid)]){
            shared_matches.push_back(match);
        }
    }
//    std::cout << "Shared matches: "<< shared_matches.size() << std::endl;

    int32_t max_score = 0;
    int32_t max_score_index = 0;
    int pos = 0;
    for (const auto& path: paths){
        // Absolute node collection for comparison
        int32_t score = 0;
        std::vector<sgNodeID_t> abs_nodes;
        for (const auto& node: path.nodes){
            abs_nodes.push_back(abs(node));
        }

        for (const auto& match: shared_matches){
            if (std::find(abs_nodes.begin(), abs_nodes.end(), abs(match.node)) != abs_nodes.end()){
                score+=match.size;
            }
        }

        if (score>max_score){
            max_score = score;
            max_score_index = pos;
        }

        pos++;
    }
//    std::cout << "Max score: "<< max_score<< " max position: "<< max_score_index << std::endl;
    return paths[max_score_index].nodes;
}